

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name.h
# Opt level: O3

int P_FindTerrain(FName *name)

{
  uint uVar1;
  FTerrainDef *pFVar2;
  
  if ((name->Index != 1) && (Terrains.Count != 0)) {
    uVar1 = 0;
    pFVar2 = Terrains.Array;
    do {
      if ((pFVar2->Name).Index == name->Index) {
        return uVar1;
      }
      uVar1 = uVar1 + 1;
      pFVar2 = pFVar2 + 1;
    } while (Terrains.Count != uVar1);
  }
  return -1;
}

Assistant:

bool operator == (ENamedName index) const { return Index == index; }